

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O2

int __thiscall helics::zeromq::ZmqComms::processIncomingMessage(ZmqComms *this,message_t *msg)

{
  bool bVar1;
  size_t sVar2;
  void *pvVar3;
  int iVar4;
  string_view message;
  ActionMessage M;
  ActionMessage Q;
  
  sVar2 = zmq::message_t::size(msg);
  if (sVar2 == 5) {
    pvVar3 = zmq::message_t::data(msg);
    sVar2 = zmq::message_t::size(msg);
    M._0_8_ = &M.dest_id;
    std::__cxx11::string::_M_construct<char_const*>((string *)&M,pvVar3,sVar2 + (long)pvVar3);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M,
                            "close");
    std::__cxx11::string::~string((string *)&M);
    if (bVar1) {
      return -1;
    }
  }
  pvVar3 = zmq::message_t::data(msg);
  sVar2 = zmq::message_t::size(msg);
  ActionMessage::ActionMessage(&M,pvVar3,sVar2);
  if (((M.messageAction == cmd_protocol_priority) || (M.messageAction == cmd_protocol)) ||
     (M.messageAction == cmd_protocol_big)) {
    if (M.messageID == 0x16570bf) {
      iVar4 = -1;
      goto LAB_0026e0f9;
    }
    if (M.messageID == 1999) {
      CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
    }
  }
  else if (M.messageAction == cmd_invalid) {
    message._M_str = "invalid command received";
    message._M_len = 0x18;
    CommsInterface::logError((CommsInterface *)this,message);
    pvVar3 = zmq::message_t::data(msg);
    sVar2 = zmq::message_t::size(msg);
    ActionMessage::ActionMessage(&Q,pvVar3,sVar2);
    ActionMessage::~ActionMessage(&Q);
    iVar4 = 0;
    goto LAB_0026e0f9;
  }
  iVar4 = 0;
  std::function<void_(helics::ActionMessage_&&)>::operator()
            (&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback,&M);
LAB_0026e0f9:
  ActionMessage::~ActionMessage(&M);
  return iVar4;
}

Assistant:

int ZmqComms::processIncomingMessage(zmq::message_t& msg)
{
    if (msg.size() == 5) {
        std::string str(static_cast<char*>(msg.data()), msg.size());
        if (str == "close") {
            return (-1);
        }
    }
    ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());
    if (!isValidCommand(M)) {
        logError("invalid command received");
        ActionMessage Q(static_cast<std::byte*>(msg.data()), msg.size());
        return 0;
    }
    if (isProtocolCommand(M)) {
        switch (M.messageID) {
            case CLOSE_RECEIVER:
                return (-1);
            case RECONNECT_RECEIVER:
                setRxStatus(ConnectionStatus::CONNECTED);
                break;
            default:
                break;
        }
    }
    ActionCallback(std::move(M));
    return 0;
}